

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# g_skill.cpp
# Opt level: O0

double G_SkillProperty(EFSkillProperty prop)

{
  uint uVar1;
  int iVar2;
  FSkillInfo *pFVar3;
  double dStack_10;
  EFSkillProperty prop_local;
  
  uVar1 = TArray<FSkillInfo,_FSkillInfo>::Size(&AllSkills);
  if (uVar1 == 0) {
switchD_005db573_default:
    dStack_10 = 0.0;
  }
  else {
    switch(prop) {
    case SKILLP_AmmoFactor:
      uVar1 = FIntCVar::operator_cast_to_int(&dmflags2);
      if ((uVar1 & 0x40) == 0) {
        iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
        pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
        dStack_10 = pFVar3->AmmoFactor;
      }
      else {
        iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
        pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
        dStack_10 = pFVar3->DoubleAmmoFactor;
      }
      break;
    case SKILLP_DropAmmoFactor:
      iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
      dStack_10 = pFVar3->DropAmmoFactor;
      break;
    case SKILLP_ArmorFactor:
      iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
      dStack_10 = pFVar3->ArmorFactor;
      break;
    case SKILLP_HealthFactor:
      iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
      dStack_10 = pFVar3->HealthFactor;
      break;
    case SKILLP_DamageFactor:
      iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
      dStack_10 = pFVar3->DamageFactor;
      break;
    case SKILLP_Aggressiveness:
      iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
      dStack_10 = pFVar3->Aggressiveness;
      break;
    case SKILLP_MonsterHealth:
      iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
      dStack_10 = pFVar3->MonsterHealth;
      break;
    case SKILLP_FriendlyHealth:
      iVar2 = FIntCVar::operator_cast_to_int(&gameskill);
      pFVar3 = TArray<FSkillInfo,_FSkillInfo>::operator[](&AllSkills,(long)iVar2);
      dStack_10 = pFVar3->FriendlyHealth;
      break;
    default:
      goto switchD_005db573_default;
    }
  }
  return dStack_10;
}

Assistant:

double G_SkillProperty(EFSkillProperty prop)
{
	if (AllSkills.Size() > 0)
	{
		switch (prop)
		{
		case SKILLP_AmmoFactor:
			if (dmflags2 & DF2_YES_DOUBLEAMMO)
			{
				return AllSkills[gameskill].DoubleAmmoFactor;
			}
			return AllSkills[gameskill].AmmoFactor;

		case SKILLP_DropAmmoFactor:
			return AllSkills[gameskill].DropAmmoFactor;

		case SKILLP_ArmorFactor:
			return AllSkills[gameskill].ArmorFactor;

		case SKILLP_HealthFactor:
			return AllSkills[gameskill].HealthFactor;

		case SKILLP_DamageFactor:
			return AllSkills[gameskill].DamageFactor;

		case SKILLP_Aggressiveness:
			return AllSkills[gameskill].Aggressiveness;

		case SKILLP_MonsterHealth:
			return AllSkills[gameskill].MonsterHealth;

		case SKILLP_FriendlyHealth:
			return AllSkills[gameskill].FriendlyHealth;

		}
	}
	return 0;
}